

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_0::isColorRenderable(deUint32 format)

{
  bool local_9;
  deUint32 format_local;
  
  if (((((format == 0x804f) || (format == 0x8051)) || (format - 0x8057 < 3)) ||
      (((format == 0x8229 || (format == 0x822b)) ||
       ((format - 0x8231 < 0xc || ((format == 0x8c43 || (format == 0x8d62)))))))) ||
     ((format == 0x8d70 ||
      (((((format == 0x8d76 || (format == 0x8d7c)) || (format == 0x8d82)) ||
        ((format == 0x8d88 || (format == 0x8d8e)))) || (format == 0x906f)))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool isColorRenderable (deUint32 format)
{
	switch (format)
	{
		case GL_R8:
		case GL_RG8:
		case GL_RGB8:
		case GL_RGB565:
		case GL_RGB4:
		case GL_RGB5_A1:
		case GL_RGBA8:
		case GL_RGB10_A2:
		case GL_RGB10_A2UI:
		case GL_SRGB8_ALPHA8:
		case GL_R8I:
		case GL_R8UI:
		case GL_R16I:
		case GL_R16UI:
		case GL_R32I:
		case GL_R32UI:
		case GL_RG8I:
		case GL_RG8UI:
		case GL_RG16I:
		case GL_RG16UI:
		case GL_RG32I:
		case GL_RG32UI:
		case GL_RGBA8I:
		case GL_RGBA8UI:
		case GL_RGBA16I:
		case GL_RGBA16UI:
		case GL_RGBA32I:
		case GL_RGBA32UI:
			return true;

		default:
			return false;
	}
}